

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t exr_attr_list_compute_size(exr_context_t ctxt,exr_attribute_list_t *list,uint64_t *out)

{
  int iVar1;
  exr_attribute_t *peVar2;
  exr_attr_opaquedata_t *u;
  exr_result_t eVar3;
  ulong in_RAX;
  code *UNRECOVERED_JUMPTABLE;
  long lVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint64_t uVar9;
  int32_t sz;
  undefined8 uStack_38;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar5 = "Missing list to compute size";
  }
  else {
    if (out != (uint64_t *)0x0) {
      *out = 0;
      iVar6 = list->num_attributes;
      if (iVar6 < 1) {
        uVar9 = 0;
      }
      else {
        lVar7 = 0;
        uVar9 = 0;
        uStack_38 = in_RAX;
        do {
          peVar2 = list->entries[lVar7];
          if (0x1c < peVar2->type - EXR_ATTR_BOX2I) {
            eVar3 = (**(code **)(ctxt + 0x48))
                              (ctxt,3,
                               "Invalid / unhandled type \'%s\' for attribute \'%s\', unable to compute size"
                               ,peVar2->type_name,peVar2->name);
            return eVar3;
          }
          lVar8 = uVar9 + peVar2->name_length;
          lVar4 = (ulong)peVar2->type_name_length + lVar8;
          uVar9 = lVar8 + (ulong)peVar2->type_name_length + 6;
          switch(peVar2->type) {
          case EXR_ATTR_BOX2I:
          case EXR_ATTR_BOX2F:
          case EXR_ATTR_V2D:
            uVar9 = lVar4 + 0x16;
            break;
          case EXR_ATTR_CHLIST:
            lVar4 = (long)((peVar2->field_6).chlist)->num_channels;
            if (0 < lVar4) {
              lVar8 = 0;
              do {
                uVar9 = uVar9 + (long)*(int *)(((peVar2->field_6).chlist)->entries->reserved +
                                              lVar8 + -0x15) + 0x11;
                lVar8 = lVar8 + 0x20;
              } while (lVar4 * 0x20 != lVar8);
            }
            break;
          case EXR_ATTR_CHROMATICITIES:
            uVar9 = lVar4 + 0x26;
            break;
          case EXR_ATTR_COMPRESSION:
          case EXR_ATTR_ENVMAP:
          case EXR_ATTR_LINEORDER:
            uVar9 = lVar4 + 7;
            break;
          default:
            uVar9 = lVar4 + 0xe;
            break;
          case EXR_ATTR_FLOAT:
          case EXR_ATTR_INT:
            uVar9 = lVar4 + 10;
            break;
          case EXR_ATTR_FLOAT_VECTOR:
            lVar4 = (long)((peVar2->field_6).chlist)->num_channels;
            goto LAB_00119531;
          case EXR_ATTR_KEYCODE:
            uVar9 = lVar4 + 0x22;
            break;
          case EXR_ATTR_M33F:
            uVar9 = lVar4 + 0x2a;
            break;
          case EXR_ATTR_M33D:
            uVar9 = lVar4 + 0x4e;
            break;
          case EXR_ATTR_M44F:
            uVar9 = lVar4 + 0x46;
            break;
          case EXR_ATTR_M44D:
            uVar9 = lVar4 + 0x86;
            break;
          case EXR_ATTR_PREVIEW:
            lVar4 = (ulong)((peVar2->field_6).preview)->height *
                    (ulong)((peVar2->field_6).preview)->width;
LAB_00119531:
            uVar9 = uVar9 + lVar4 * 4;
            break;
          case EXR_ATTR_STRING:
            iVar1 = ((peVar2->field_6).chlist)->num_channels;
LAB_00119575:
            uVar9 = uVar9 + (long)iVar1;
            break;
          case EXR_ATTR_STRING_VECTOR:
            lVar4 = (long)((peVar2->field_6).chlist)->num_channels;
            if (0 < lVar4) {
              lVar8 = 0;
              do {
                uVar9 = uVar9 + (long)*(int *)(((peVar2->field_6).chlist)->entries->reserved +
                                              lVar8 + -0x15) + 4;
                lVar8 = lVar8 + 0x10;
              } while (lVar4 * 0x10 != lVar8);
            }
            break;
          case EXR_ATTR_TILEDESC:
            uVar9 = lVar4 + 0xf;
            break;
          case EXR_ATTR_V3I:
          case EXR_ATTR_V3F:
            uVar9 = lVar4 + 0x12;
            break;
          case EXR_ATTR_V3D:
            uVar9 = lVar4 + 0x1e;
            break;
          case EXR_ATTR_OPAQUE:
            u = (peVar2->field_6).opaque;
            if (u->packed_data != (void *)0x0) {
              iVar1 = u->size;
              goto LAB_00119575;
            }
            if (u->unpacked_data != (void *)0x0) {
              uStack_38 = uStack_38 & 0xffffffff;
              eVar3 = exr_attr_opaquedata_pack
                                (ctxt,u,(int32_t *)((long)&uStack_38 + 4),(void **)0x0);
              if (eVar3 != 0) {
                return eVar3;
              }
              uVar9 = uVar9 + (long)uStack_38._4_4_;
              iVar6 = list->num_attributes;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar6);
      }
      *out = uVar9;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar5 = "Expected output pointer";
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar5);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_compute_size (
    exr_context_t ctxt, exr_attribute_list_t* list, uint64_t* out)
{
    uint64_t     retval = 0;
    exr_result_t rv     = EXR_ERR_SUCCESS;

    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);

    if (!list)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Missing list to compute size");

    if (!out)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Expected output pointer");

    *out = 0;
    for (int i = 0; i < list->num_attributes; ++i)
    {
        const exr_attribute_t* cur = list->entries[i];
        retval += (size_t) cur->name_length + 1;
        retval += (size_t) cur->type_name_length + 1;
        retval += sizeof (int32_t);
        switch (cur->type)
        {
            case EXR_ATTR_BOX2I: retval += sizeof (*(cur->box2i)); break;
            case EXR_ATTR_BOX2F: retval += sizeof (*(cur->box2f)); break;
            case EXR_ATTR_CHLIST:
                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    retval += (size_t) cur->chlist->entries[c].name.length + 1;
                    retval += sizeof (int32_t) * 4;
                }
                break;
            case EXR_ATTR_CHROMATICITIES:
                retval += sizeof (*(cur->chromaticities));
                break;
            case EXR_ATTR_COMPRESSION:
            case EXR_ATTR_ENVMAP:
            case EXR_ATTR_LINEORDER: retval += sizeof (uint8_t); break;
            case EXR_ATTR_DOUBLE: retval += sizeof (double); break;
            case EXR_ATTR_FLOAT: retval += sizeof (float); break;
            case EXR_ATTR_FLOAT_VECTOR:
                retval += sizeof (float) * (size_t) (cur->floatvector->length);
                break;
            case EXR_ATTR_INT: retval += sizeof (int32_t); break;
            case EXR_ATTR_KEYCODE: retval += sizeof (*(cur->keycode)); break;
            case EXR_ATTR_M33F: retval += sizeof (*(cur->m33f)); break;
            case EXR_ATTR_M33D: retval += sizeof (*(cur->m33d)); break;
            case EXR_ATTR_M44F: retval += sizeof (*(cur->m44f)); break;
            case EXR_ATTR_M44D: retval += sizeof (*(cur->m44d)); break;
            case EXR_ATTR_PREVIEW:
                retval += (size_t) cur->preview->width *
                          (size_t) cur->preview->height * (size_t) 4;
                break;
            case EXR_ATTR_RATIONAL: retval += sizeof (*(cur->rational)); break;
            case EXR_ATTR_STRING: retval += (size_t) cur->string->length; break;
            case EXR_ATTR_STRING_VECTOR:
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    retval += (size_t) cur->stringvector->strings[s].length;
                    retval += sizeof (int32_t);
                }
                break;
            case EXR_ATTR_TILEDESC: retval += sizeof (*(cur->tiledesc)); break;
            case EXR_ATTR_TIMECODE: retval += sizeof (*(cur->timecode)); break;
            case EXR_ATTR_V2I: retval += sizeof (*(cur->v2i)); break;
            case EXR_ATTR_V2F: retval += sizeof (*(cur->v2f)); break;
            case EXR_ATTR_V2D: retval += sizeof (*(cur->v2d)); break;
            case EXR_ATTR_V3I: retval += sizeof (*(cur->v3i)); break;
            case EXR_ATTR_V3F: retval += sizeof (*(cur->v3f)); break;
            case EXR_ATTR_V3D: retval += sizeof (*(cur->v3d)); break;
            case EXR_ATTR_OPAQUE:
                if (cur->opaque->packed_data)
                    retval += (size_t) cur->opaque->size;
                else if (cur->opaque->unpacked_data)
                {
                    int32_t sz = 0;
                    rv =
                        exr_attr_opaquedata_pack (ctxt, cur->opaque, &sz, NULL);
                    if (rv != EXR_ERR_SUCCESS) return rv;

                    retval += (size_t) sz;
                }
                break;
            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default:
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unhandled type '%s' for attribute '%s', unable to compute size",
                    cur->type_name,
                    cur->name);
        }
    }

    *out = retval;
    return rv;
}